

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O2

void double_conversion::DoubleToStringConverter::DoubleToAscii
               (double v,DtoaMode mode,int requested_digits,char *buffer,int buffer_length,
               bool *sign,int *length,int *point)

{
  undefined1 auVar1 [16];
  bool bVar2;
  undefined4 in_EAX;
  undefined4 uVar3;
  int fractional_count;
  FastDtoaMode mode_00;
  double_conversion *this;
  double decimal_point;
  undefined8 in_XMM0_Qb;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = v;
  uVar3 = movmskpd(in_EAX,auVar1);
  *sign = (bool)((byte)uVar3 & 1);
  if (mode == PRECISION && requested_digits == 0) {
    *buffer = '\0';
    *length = 0;
    return;
  }
  if ((v == 0.0) && (!NAN(v))) {
    buffer[0] = '0';
    buffer[1] = '\0';
    *length = 1;
    *point = 1;
    return;
  }
  if (PRECISION < mode) {
    abort();
  }
  decimal_point = ABS(v);
  fractional_count = (int)buffer;
  switch(mode) {
  case SHORTEST:
    this = (double_conversion *)0x0;
    break;
  case SHORTEST_SINGLE:
    this = (double_conversion *)0x1;
    break;
  case FIXED:
    buffer_00.start_ = (char *)(ulong)(uint)buffer_length;
    buffer_00._8_8_ = length;
    bVar2 = FastFixedDtoa((double_conversion *)(ulong)(uint)requested_digits,decimal_point,
                          fractional_count,buffer_00,point,length);
    goto LAB_00395bdc;
  case PRECISION:
    this = (double_conversion *)0x2;
    mode_00 = requested_digits;
    goto LAB_00395bcc;
  }
  mode_00 = FAST_DTOA_SHORTEST;
LAB_00395bcc:
  buffer_01.start_ = (char *)(ulong)(uint)buffer_length;
  buffer_01._8_8_ = length;
  bVar2 = FastDtoa(this,decimal_point,mode_00,fractional_count,buffer_01,point,(int *)decimal_point)
  ;
LAB_00395bdc:
  if (bVar2 == false) {
    buffer_02.start_ = (char *)(ulong)(uint)buffer_length;
    buffer_02._8_8_ = length;
    BignumDtoa((double_conversion *)(ulong)mode,decimal_point,requested_digits,fractional_count,
               buffer_02,point,(int *)decimal_point);
    buffer[*length] = '\0';
  }
  return;
}

Assistant:

void DoubleToStringConverter::DoubleToAscii(double v,
                                            DtoaMode mode,
                                            int requested_digits,
                                            char* buffer,
                                            int buffer_length,
                                            bool* sign,
                                            int* length,
                                            int* point) {
  Vector<char> vector(buffer, buffer_length);
  DOUBLE_CONVERSION_ASSERT(!Double(v).IsSpecial());
  DOUBLE_CONVERSION_ASSERT(mode == SHORTEST || mode == SHORTEST_SINGLE || requested_digits >= 0);

  if (Double(v).Sign() < 0) {
    *sign = true;
    v = -v;
  } else {
    *sign = false;
  }

  if (mode == PRECISION && requested_digits == 0) {
    vector[0] = '\0';
    *length = 0;
    return;
  }

  if (v == 0) {
    vector[0] = '0';
    vector[1] = '\0';
    *length = 1;
    *point = 1;
    return;
  }

  bool fast_worked;
  switch (mode) {
    case SHORTEST:
      fast_worked = FastDtoa(v, FAST_DTOA_SHORTEST, 0, vector, length, point);
      break;
    case SHORTEST_SINGLE:
      fast_worked = FastDtoa(v, FAST_DTOA_SHORTEST_SINGLE, 0,
                             vector, length, point);
      break;
    case FIXED:
      fast_worked = FastFixedDtoa(v, requested_digits, vector, length, point);
      break;
    case PRECISION:
      fast_worked = FastDtoa(v, FAST_DTOA_PRECISION, requested_digits,
                             vector, length, point);
      break;
    default:
      fast_worked = false;
      DOUBLE_CONVERSION_UNREACHABLE();
  }
  if (fast_worked) return;

  // If the fast dtoa didn't succeed use the slower bignum version.
  BignumDtoaMode bignum_mode = DtoaToBignumDtoaMode(mode);
  BignumDtoa(v, bignum_mode, requested_digits, vector, length, point);
  vector[*length] = '\0';
}